

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoint_approach.cpp
# Opt level: O1

size_t test_orb_param(Mat *image_model,Mat *image_test,ORB_Param *val)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keypoint_test;
  _InputArray *keypoint_model;
  vector<cv::DMatch,_std::allocator<cv::DMatch>_> filtered_matches;
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  knn_matches;
  Ptr<cv::DescriptorMatcher> matcher;
  _InputArray local_170;
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  local_158;
  _InputArray *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  undefined4 local_128 [2];
  Mat *local_120;
  undefined8 local_118;
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> local_110;
  pair<std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>,_cv::Mat> local_98;
  
  keypoint_compute(&local_98,image_model,val);
  keypoint_compute(&local_110,image_test,val);
  local_158.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_158.
                         super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  cv::DescriptorMatcher::create((MatcherType *)&local_138);
  local_158.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_170.sz.width = 0;
  local_170.sz.height = 0;
  local_170.flags = 0x1010000;
  local_118 = 0;
  local_128[0] = 0x1010000;
  local_170.obj = &local_98.second;
  local_120 = &local_110.second;
  bVar3 = (bool)cv::noArray();
  keypoint_model = &local_170;
  cv::DescriptorMatcher::knnMatch
            (local_138,keypoint_model,(vector *)local_128,(int)&local_158,(_InputArray *)0x2,bVar3);
  filter_match((vector<cv::DMatch,_std::allocator<cv::DMatch>_> *)&local_170,
               (vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)keypoint_model,keypoint_test,
               &local_158,0.75);
  pvVar2 = local_170.obj;
  pvVar1 = (void *)CONCAT44(local_170._4_4_,local_170.flags);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_170.sz - (long)pvVar1);
  }
  std::
  vector<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>,_std::allocator<std::vector<cv::DMatch,_std::allocator<cv::DMatch>_>_>_>
  ::~vector(&local_158);
  if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
  }
  cv::Mat::~Mat(&local_110.second);
  if (local_110.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.first.
                          super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.first.
                          super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cv::Mat::~Mat(&local_98.second);
  if (local_98.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.first.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.first.
                          super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.first.
                          super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (long)pvVar2 - (long)pvVar1 >> 4;
}

Assistant:

std::size_t test_orb_param(const cv::Mat& image_model, const cv::Mat& image_test, const ORB_Param& val)
{
    auto [keypoint_model, descriptor_model] = keypoint_compute(image_model, val);
    auto [keypoint_test, descriptor_test] = keypoint_compute(image_test, val);

#if CV_MAJOR_VERSION < 3
    auto matcher = cv::DescriptorMatcher::create("NORM_HAMMING");
#else
    auto matcher = cv::DescriptorMatcher::create(cv::DescriptorMatcher::BRUTEFORCE_HAMMING);
#endif

    std::vector<std::vector<cv::DMatch>> knn_matches;
    matcher->knnMatch(descriptor_model, descriptor_test, knn_matches, 2);

    const float ratio_thresh = 0.75f;
    std::vector<cv::DMatch> filtered_matches = filter_match(keypoint_model, keypoint_test, knn_matches, ratio_thresh);
    return filtered_matches.size();
}